

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t __thiscall
c4::yml::Tree::_next_node_modify(Tree *this,lookup_result *r,_lookup_path_token *parent)

{
  Location LVar1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location loc;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location loc_06;
  Location loc_07;
  Location loc_08;
  Location loc_09;
  Location loc_10;
  csubstr str;
  csubstr str_00;
  csubstr key;
  csubstr key_00;
  csubstr val;
  csubstr val_00;
  csubstr key_01;
  bool bVar11;
  error_flags eVar12;
  csubstr *pcVar13;
  NodeData *pNVar14;
  size_t sVar15;
  undefined8 *in_RDX;
  long in_RSI;
  Tree *in_RDI;
  char msg_9 [29];
  size_t i;
  char msg_8 [48];
  char msg_7 [41];
  csubstr k;
  size_t idx;
  char msg_6 [75];
  NodeData *n_1;
  char msg_5 [36];
  char msg_4 [40];
  NodeData *n;
  char msg_3 [35];
  char msg_2 [28];
  char msg_1 [42];
  size_t pos;
  char msg [46];
  size_t node;
  _lookup_path_token token;
  size_t child;
  size_t child_1;
  size_t child_2;
  size_t child_3;
  lookup_result *in_stack_fffffffffffff4e8;
  Tree *in_stack_fffffffffffff4f0;
  undefined7 in_stack_fffffffffffff4f8;
  char in_stack_fffffffffffff4ff;
  Tree *in_stack_fffffffffffff500;
  char *in_stack_fffffffffffff508;
  Location *in_stack_fffffffffffff510;
  Location *this_00;
  Tree *in_stack_fffffffffffff518;
  pfn_error p_Var16;
  size_t in_stack_fffffffffffff538;
  Tree *in_stack_fffffffffffff540;
  Tree *in_stack_fffffffffffff548;
  char *pcVar17;
  pfn_error in_stack_fffffffffffff550;
  char *in_stack_fffffffffffff558;
  pfn_error in_stack_fffffffffffff560;
  undefined5 in_stack_fffffffffffff568;
  undefined1 in_stack_fffffffffffff56d;
  undefined1 in_stack_fffffffffffff56e;
  undefined1 in_stack_fffffffffffff56f;
  size_t in_stack_fffffffffffff570;
  _lookup_path_token *p_Var18;
  size_t in_stack_fffffffffffff588;
  size_t in_stack_fffffffffffff590;
  Tree *in_stack_fffffffffffff598;
  undefined7 in_stack_fffffffffffff5e0;
  undefined1 in_stack_fffffffffffff5e7;
  char *in_stack_fffffffffffff5e8;
  size_t in_stack_fffffffffffff5f0;
  type_bits in_stack_fffffffffffff600;
  size_t in_stack_fffffffffffff608;
  Tree *in_stack_fffffffffffff610;
  pfn_error in_stack_fffffffffffff640;
  Tree *pTVar19;
  Tree *in_stack_fffffffffffff650;
  char *in_stack_fffffffffffff658;
  size_t in_stack_fffffffffffff660;
  undefined8 uStack_998;
  size_t local_990;
  size_t in_stack_fffffffffffff678;
  Tree *in_stack_fffffffffffff680;
  size_t in_stack_fffffffffffff688;
  undefined4 in_stack_fffffffffffff690;
  undefined4 in_stack_fffffffffffff694;
  size_t in_stack_fffffffffffff698;
  undefined4 in_stack_fffffffffffff6a0;
  undefined4 in_stack_fffffffffffff6a4;
  basic_substring<const_char> local_958;
  Tree *in_stack_fffffffffffff6c0;
  char *in_stack_fffffffffffff6c8;
  Tree *in_stack_fffffffffffff6d0;
  ulong local_928;
  lookup_result *local_920;
  Tree *pTStack_918;
  undefined8 local_910;
  Tree *pTStack_908;
  char *in_stack_fffffffffffff700;
  char local_8f8 [56];
  lookup_result *local_8c0;
  Tree *pTStack_8b8;
  undefined8 local_8b0;
  Tree *pTStack_8a8;
  char *local_8a0;
  char local_898 [48];
  char *local_868;
  size_t local_860;
  char *local_858;
  size_t local_850;
  char *local_848;
  size_t local_840;
  ulong local_838;
  undefined8 local_830;
  undefined8 local_828;
  char *local_820;
  _lookup_path_token *parent_00;
  lookup_result *in_stack_fffffffffffff7f0;
  Tree *in_stack_fffffffffffff7f8;
  undefined8 local_800;
  Tree *pTStack_7f8;
  char *local_7f0;
  char local_7e8 [80];
  NodeData *local_798;
  lookup_result *local_790;
  Tree *pTStack_788;
  undefined8 local_780;
  Tree *pTStack_778;
  char *local_770;
  char local_768 [40];
  lookup_result *local_740;
  Tree *pTStack_738;
  undefined8 local_730;
  Tree *pTStack_728;
  char *local_720;
  char local_718 [48];
  csubstr local_6e8;
  NodeData *local_6d8;
  lookup_result *local_6d0;
  Tree *pTStack_6c8;
  undefined8 local_6c0;
  Tree *pTStack_6b8;
  char *local_6b0;
  char local_6a8 [40];
  lookup_result *local_680;
  Tree *pTStack_678;
  undefined8 local_670;
  Tree *pTStack_668;
  char *local_660;
  size_t in_stack_fffffffffffff9a8;
  size_t in_stack_fffffffffffff9b0;
  size_t in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  lookup_result *in_stack_fffffffffffff9d0;
  Tree *in_stack_fffffffffffff9d8;
  undefined8 in_stack_fffffffffffff9e0;
  Tree *pTStack_618;
  char *local_610;
  char local_608 [48];
  char *local_5d8;
  size_t local_5d0;
  long local_5c8;
  char *local_5c0;
  size_t local_5b8;
  lookup_result *local_5b0;
  Tree *pTStack_5a8;
  undefined8 local_5a0;
  Tree *pTStack_598;
  char *local_590;
  char local_588 [48];
  size_t local_558;
  _lookup_path_token local_550;
  undefined8 *local_538;
  long local_530;
  csubstr *local_518;
  char *local_510;
  undefined4 local_508;
  char *local_500;
  undefined4 local_4f8;
  char *local_4f0;
  undefined4 local_4e8;
  ulong local_4e0;
  ulong local_4d8;
  _lookup_path_token *local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  NodeType *local_4b0;
  undefined8 local_4a8;
  NodeType *local_4a0;
  undefined8 local_498;
  NodeType *local_490;
  undefined8 local_488;
  NodeType *local_480;
  undefined8 local_478;
  NodeData *local_470;
  undefined8 local_468;
  NodeData *local_460;
  size_t local_458;
  size_t local_448;
  size_t local_438;
  size_t local_428;
  undefined8 local_418;
  undefined8 local_408;
  NodeData *local_3f8;
  NodeData *local_3f0;
  undefined8 local_3e8;
  NodeData *local_3d8;
  undefined8 local_3d0;
  NodeData *local_3c0;
  undefined8 local_3b8;
  NodeData *local_3a8;
  undefined8 local_3a0;
  NodeData *local_390;
  undefined8 local_388;
  NodeData *local_378;
  undefined8 local_370;
  NodeData *local_360;
  undefined8 local_358;
  undefined8 local_348;
  undefined8 local_338;
  char *local_328;
  size_t local_320;
  ulong *local_318;
  char *local_310;
  size_t local_308;
  char *local_300;
  size_t local_2f8;
  long *local_2f0;
  char *local_2e8;
  size_t local_2e0;
  size_t local_2d8;
  Tree *pTStack_2c8;
  undefined8 local_2c0;
  Tree *pTStack_2b8;
  char *local_2b0;
  lookup_result *local_2a8;
  Tree *pTStack_2a0;
  undefined8 local_298;
  Tree *pTStack_290;
  char *local_288;
  lookup_result *local_280;
  Tree *pTStack_278;
  undefined8 local_270;
  Tree *pTStack_268;
  char *local_260;
  size_t local_258;
  size_t local_250;
  size_t local_240;
  size_t local_230;
  lookup_result *local_228;
  Tree *pTStack_220;
  undefined8 local_218;
  Tree *pTStack_210;
  char *local_208;
  lookup_result *local_200;
  Tree *pTStack_1f8;
  undefined8 local_1f0;
  Tree *pTStack_1e8;
  char *local_1e0;
  lookup_result *local_1d8;
  Tree *pTStack_1d0;
  undefined8 local_1c8;
  Tree *pTStack_1c0;
  char *local_1b8;
  size_t local_1b0;
  size_t local_1a8;
  size_t local_198;
  size_t local_188;
  lookup_result *local_180;
  Tree *pTStack_178;
  undefined8 local_170;
  Tree *pTStack_168;
  char *local_160;
  lookup_result *local_158;
  Tree *pTStack_150;
  undefined8 local_148;
  Tree *pTStack_140;
  char *local_138;
  lookup_result *local_130;
  Tree *pTStack_128;
  undefined8 local_120;
  Tree *pTStack_118;
  char *local_110;
  size_t local_108;
  size_t local_100;
  size_t local_f0;
  size_t local_e0;
  lookup_result *local_d8;
  Tree *pTStack_d0;
  undefined8 local_c8;
  Tree *pTStack_c0;
  char *local_b8;
  lookup_result *local_b0;
  Tree *pTStack_a8;
  undefined8 local_a0;
  Tree *pTStack_98;
  char *local_90;
  lookup_result *local_88;
  Tree *pTStack_80;
  undefined8 local_78;
  Tree *pTStack_70;
  char *local_68;
  size_t local_60;
  size_t local_58;
  size_t local_48;
  NodeData *local_38;
  NodeData *local_30;
  NodeData *local_28;
  NodeData *local_20;
  NodeData *local_18;
  NodeData *local_10;
  NodeData *local_8;
  
  local_538 = in_RDX;
  local_530 = in_RSI;
  _next_token(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,parent_00);
  bVar11 = _lookup_path_token::operator_cast_to_bool(&local_550);
  if (!bVar11) {
    return 0xffffffffffffffff;
  }
  local_558 = 0xffffffffffffffff;
  local_480 = &local_550.type;
  local_488 = 4;
  if (local_550.type.type != MAP) {
    local_490 = &local_550.type;
    local_498 = 8;
    if (local_550.type.type != SEQ) {
      local_4a0 = &local_550.type;
      local_4a8 = 3;
      if (local_550.type.type == KEYVAL) {
        local_6e8 = lookup_result::unresolved((lookup_result *)in_stack_fffffffffffff4f0);
        local_518 = &local_6e8;
        bVar11 = true;
        if (local_6e8.len != 0) {
          bVar11 = local_6e8.str == (char *)0x0;
        }
        if (!bVar11) {
          memcpy(local_718,"check failed: (r->unresolved().empty())",0x28);
          eVar12 = get_error_flags();
          if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
            trap_instruction();
          }
          p_Var16 = (in_RDI->m_callbacks).m_error;
          Location::Location(in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                             (size_t)in_stack_fffffffffffff500,
                             CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                             (size_t)in_stack_fffffffffffff4f0);
          in_stack_fffffffffffff4f8 = (undefined7)local_730;
          in_stack_fffffffffffff4ff = (char)((ulong)local_730 >> 0x38);
          LVar5.super_LineCol.line = (size_t)pTStack_738;
          LVar5.super_LineCol.offset = (size_t)local_740;
          LVar5.super_LineCol.col._0_7_ = in_stack_fffffffffffff4f8;
          LVar5.super_LineCol.col._7_1_ = in_stack_fffffffffffff4ff;
          LVar5.name.str = (char *)pTStack_728;
          LVar5.name.len = (size_t)local_720;
          (*p_Var16)(local_718,0x28,LVar5,(in_RDI->m_callbacks).m_user_data);
          in_stack_fffffffffffff4e8 = local_740;
          in_stack_fffffffffffff4f0 = pTStack_738;
          in_stack_fffffffffffff500 = pTStack_728;
          in_stack_fffffffffffff508 = local_720;
        }
        local_3d0 = *(undefined8 *)(local_530 + 8);
        local_3c0 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
        if (((local_3c0->m_type).type & MAP) == NOTYPE) {
          local_370 = *(undefined8 *)(local_530 + 8);
          local_360 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
          if (((local_360->m_type).type & SEQ) != NOTYPE) {
            memcpy(local_768,"check failed: (!is_seq(r->closest))",0x24);
            eVar12 = get_error_flags();
            if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
              trap_instruction();
            }
            p_Var16 = (in_RDI->m_callbacks).m_error;
            Location::Location(in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                               (size_t)in_stack_fffffffffffff500,
                               CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                               (size_t)in_stack_fffffffffffff4f0);
            in_stack_fffffffffffff4f8 = (undefined7)local_780;
            in_stack_fffffffffffff4ff = (char)((ulong)local_780 >> 0x38);
            LVar6.super_LineCol.line = (size_t)pTStack_788;
            LVar6.super_LineCol.offset = (size_t)local_790;
            LVar6.super_LineCol.col._0_7_ = in_stack_fffffffffffff4f8;
            LVar6.super_LineCol.col._7_1_ = in_stack_fffffffffffff4ff;
            LVar6.name.str = (char *)pTStack_778;
            LVar6.name.len = (size_t)local_770;
            (*p_Var16)(local_768,0x24,LVar6,(in_RDI->m_callbacks).m_user_data);
            in_stack_fffffffffffff4e8 = local_790;
            in_stack_fffffffffffff4f0 = pTStack_788;
            in_stack_fffffffffffff500 = pTStack_778;
            in_stack_fffffffffffff508 = local_770;
          }
          _add_flags(in_stack_fffffffffffff518,(size_t)in_stack_fffffffffffff510,
                     (NodeType_e)in_stack_fffffffffffff508);
          sVar15 = *(size_t *)(local_530 + 8);
          local_448 = sVar15;
          pNVar14 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
          local_108 = pNVar14->m_last_child;
          local_100 = sVar15;
          if (sVar15 == 0xffffffffffffffff) {
            eVar12 = get_error_flags();
            if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
              trap_instruction();
            }
            Location::Location((Location *)in_stack_fffffffffffff500,
                               (char *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8)
                               ,(size_t)in_stack_fffffffffffff4f0,(size_t)in_stack_fffffffffffff4e8)
            ;
            in_stack_fffffffffffff4f8 = (undefined7)local_120;
            in_stack_fffffffffffff4ff = (char)((ulong)local_120 >> 0x38);
            loc_05.super_LineCol.line = (size_t)in_stack_fffffffffffff558;
            loc_05.super_LineCol.offset = (size_t)in_stack_fffffffffffff550;
            loc_05.super_LineCol.col = (size_t)in_stack_fffffffffffff560;
            loc_05.name.str._0_5_ = in_stack_fffffffffffff568;
            loc_05.name.str._5_1_ = in_stack_fffffffffffff56d;
            loc_05.name.str._6_1_ = in_stack_fffffffffffff56e;
            loc_05.name.str._7_1_ = in_stack_fffffffffffff56f;
            loc_05.name.len = in_stack_fffffffffffff570;
            error<29ul>((char (*) [29])in_stack_fffffffffffff540,loc_05);
            in_stack_fffffffffffff4e8 = local_130;
            in_stack_fffffffffffff4f0 = pTStack_128;
            in_stack_fffffffffffff500 = pTStack_118;
            in_stack_fffffffffffff508 = local_110;
          }
          local_f0 = local_100;
          local_30 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
          if ((((local_30->m_type).type & (STREAM|MAP)) == NOTYPE) &&
             (bVar11 = is_root(in_stack_fffffffffffff540,in_stack_fffffffffffff538), !bVar11)) {
            eVar12 = get_error_flags();
            if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
              trap_instruction();
            }
            Location::Location((Location *)in_stack_fffffffffffff500,
                               (char *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8)
                               ,(size_t)in_stack_fffffffffffff4f0,(size_t)in_stack_fffffffffffff4e8)
            ;
            in_stack_fffffffffffff4f8 = (undefined7)local_148;
            in_stack_fffffffffffff4ff = (char)((ulong)local_148 >> 0x38);
            loc_06.super_LineCol.line = (size_t)in_stack_fffffffffffff558;
            loc_06.super_LineCol.offset = (size_t)in_stack_fffffffffffff550;
            loc_06.super_LineCol.col = (size_t)in_stack_fffffffffffff560;
            loc_06.name.str._0_5_ = in_stack_fffffffffffff568;
            loc_06.name.str._5_1_ = in_stack_fffffffffffff56d;
            loc_06.name.str._6_1_ = in_stack_fffffffffffff56e;
            loc_06.name.str._7_1_ = in_stack_fffffffffffff56f;
            loc_06.name.len = in_stack_fffffffffffff570;
            error<54ul>((char (*) [54])in_stack_fffffffffffff540,loc_06);
            in_stack_fffffffffffff4e8 = local_158;
            in_stack_fffffffffffff4f0 = pTStack_150;
            in_stack_fffffffffffff500 = pTStack_140;
            in_stack_fffffffffffff508 = local_138;
          }
          if ((local_108 != 0xffffffffffffffff) &&
             (pNVar14 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538),
             pNVar14->m_parent != local_100)) {
            eVar12 = get_error_flags();
            if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
              trap_instruction();
            }
            Location::Location((Location *)in_stack_fffffffffffff500,
                               (char *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8)
                               ,(size_t)in_stack_fffffffffffff4f0,(size_t)in_stack_fffffffffffff4e8)
            ;
            in_stack_fffffffffffff4f8 = (undefined7)local_170;
            in_stack_fffffffffffff4ff = (char)((ulong)local_170 >> 0x38);
            loc_07.super_LineCol.line = (size_t)in_stack_fffffffffffff558;
            loc_07.super_LineCol.offset = (size_t)in_stack_fffffffffffff550;
            loc_07.super_LineCol.col = (size_t)in_stack_fffffffffffff560;
            loc_07.name.str._0_5_ = in_stack_fffffffffffff568;
            loc_07.name.str._5_1_ = in_stack_fffffffffffff56d;
            loc_07.name.str._6_1_ = in_stack_fffffffffffff56e;
            loc_07.name.str._7_1_ = in_stack_fffffffffffff56f;
            loc_07.name.len = in_stack_fffffffffffff570;
            error<63ul>((char (*) [63])in_stack_fffffffffffff540,loc_07);
            in_stack_fffffffffffff4e8 = local_180;
            in_stack_fffffffffffff4f0 = pTStack_178;
            in_stack_fffffffffffff500 = pTStack_168;
            in_stack_fffffffffffff508 = local_160;
          }
          local_188 = _claim(in_stack_fffffffffffff6c0);
          _set_hierarchy((Tree *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                         in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,
                         in_stack_fffffffffffff9a8);
          local_558 = local_188;
        }
        else {
          local_558 = find_child(in_stack_fffffffffffff6d0,(size_t)in_stack_fffffffffffff6c8,
                                 (csubstr *)in_stack_fffffffffffff6c0);
          if (local_558 == 0xffffffffffffffff) {
            sVar15 = *(size_t *)(local_530 + 8);
            local_438 = sVar15;
            pNVar14 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
            local_1b0 = pNVar14->m_last_child;
            local_1a8 = sVar15;
            if (sVar15 == 0xffffffffffffffff) {
              eVar12 = get_error_flags();
              if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
                trap_instruction();
              }
              Location::Location((Location *)in_stack_fffffffffffff500,
                                 (char *)CONCAT17(in_stack_fffffffffffff4ff,
                                                  in_stack_fffffffffffff4f8),
                                 (size_t)in_stack_fffffffffffff4f0,(size_t)in_stack_fffffffffffff4e8
                                );
              in_stack_fffffffffffff4f8 = (undefined7)local_1c8;
              in_stack_fffffffffffff4ff = (char)((ulong)local_1c8 >> 0x38);
              loc_02.super_LineCol.line = (size_t)in_stack_fffffffffffff558;
              loc_02.super_LineCol.offset = (size_t)in_stack_fffffffffffff550;
              loc_02.super_LineCol.col = (size_t)in_stack_fffffffffffff560;
              loc_02.name.str._0_5_ = in_stack_fffffffffffff568;
              loc_02.name.str._5_1_ = in_stack_fffffffffffff56d;
              loc_02.name.str._6_1_ = in_stack_fffffffffffff56e;
              loc_02.name.str._7_1_ = in_stack_fffffffffffff56f;
              loc_02.name.len = in_stack_fffffffffffff570;
              error<29ul>((char (*) [29])in_stack_fffffffffffff540,loc_02);
              in_stack_fffffffffffff4e8 = local_1d8;
              in_stack_fffffffffffff4f0 = pTStack_1d0;
              in_stack_fffffffffffff500 = pTStack_1c0;
              in_stack_fffffffffffff508 = local_1b8;
            }
            local_198 = local_1a8;
            local_28 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
            if ((((local_28->m_type).type & (STREAM|MAP)) == NOTYPE) &&
               (bVar11 = is_root(in_stack_fffffffffffff540,in_stack_fffffffffffff538), !bVar11)) {
              eVar12 = get_error_flags();
              if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
                trap_instruction();
              }
              Location::Location((Location *)in_stack_fffffffffffff500,
                                 (char *)CONCAT17(in_stack_fffffffffffff4ff,
                                                  in_stack_fffffffffffff4f8),
                                 (size_t)in_stack_fffffffffffff4f0,(size_t)in_stack_fffffffffffff4e8
                                );
              in_stack_fffffffffffff4f8 = (undefined7)local_1f0;
              in_stack_fffffffffffff4ff = (char)((ulong)local_1f0 >> 0x38);
              loc_03.super_LineCol.line = (size_t)in_stack_fffffffffffff558;
              loc_03.super_LineCol.offset = (size_t)in_stack_fffffffffffff550;
              loc_03.super_LineCol.col = (size_t)in_stack_fffffffffffff560;
              loc_03.name.str._0_5_ = in_stack_fffffffffffff568;
              loc_03.name.str._5_1_ = in_stack_fffffffffffff56d;
              loc_03.name.str._6_1_ = in_stack_fffffffffffff56e;
              loc_03.name.str._7_1_ = in_stack_fffffffffffff56f;
              loc_03.name.len = in_stack_fffffffffffff570;
              error<54ul>((char (*) [54])in_stack_fffffffffffff540,loc_03);
              in_stack_fffffffffffff4e8 = local_200;
              in_stack_fffffffffffff4f0 = pTStack_1f8;
              in_stack_fffffffffffff500 = pTStack_1e8;
              in_stack_fffffffffffff508 = local_1e0;
            }
            if ((local_1b0 != 0xffffffffffffffff) &&
               (pNVar14 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538),
               pNVar14->m_parent != local_1a8)) {
              eVar12 = get_error_flags();
              if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
                trap_instruction();
              }
              Location::Location((Location *)in_stack_fffffffffffff500,
                                 (char *)CONCAT17(in_stack_fffffffffffff4ff,
                                                  in_stack_fffffffffffff4f8),
                                 (size_t)in_stack_fffffffffffff4f0,(size_t)in_stack_fffffffffffff4e8
                                );
              in_stack_fffffffffffff4f8 = (undefined7)local_218;
              in_stack_fffffffffffff4ff = (char)((ulong)local_218 >> 0x38);
              loc_04.super_LineCol.line = (size_t)in_stack_fffffffffffff558;
              loc_04.super_LineCol.offset = (size_t)in_stack_fffffffffffff550;
              loc_04.super_LineCol.col = (size_t)in_stack_fffffffffffff560;
              loc_04.name.str._0_5_ = in_stack_fffffffffffff568;
              loc_04.name.str._5_1_ = in_stack_fffffffffffff56d;
              loc_04.name.str._6_1_ = in_stack_fffffffffffff56e;
              loc_04.name.str._7_1_ = in_stack_fffffffffffff56f;
              loc_04.name.len = in_stack_fffffffffffff570;
              error<63ul>((char (*) [63])in_stack_fffffffffffff540,loc_04);
              in_stack_fffffffffffff4e8 = local_228;
              in_stack_fffffffffffff4f0 = pTStack_220;
              in_stack_fffffffffffff500 = pTStack_210;
              in_stack_fffffffffffff508 = local_208;
            }
            local_230 = _claim(in_stack_fffffffffffff6c0);
            _set_hierarchy((Tree *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                           in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,
                           in_stack_fffffffffffff9a8);
            local_558 = local_230;
          }
        }
        local_798 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
        (local_798->m_key).scalar.str = local_550.value.str;
        (local_798->m_key).scalar.len = local_550.value.len;
        basic_substring<char_const>::operator=
                  ((basic_substring<const_char> *)in_stack_fffffffffffff4f0,
                   (char (*) [1])in_stack_fffffffffffff4e8);
        local_470 = local_798;
        local_478 = 3;
        (local_798->m_type).type = (local_798->m_type).type | KEYVAL;
      }
      else {
        local_4b0 = &local_550.type;
        local_4b8 = 2;
        if (local_550.type.type == KEY) {
          bVar11 = basic_substring<const_char>::begins_with(&local_550.value,'[');
          if ((!bVar11) ||
             (bVar11 = basic_substring<const_char>::ends_with(&local_550.value,']'), !bVar11)) {
            in_stack_fffffffffffff4e8 = in_stack_fffffffffffff7f0;
            memcpy(local_7e8,
                   "check failed: (token.value.begins_with(\'[\') && token.value.ends_with(\']\'))",
                   0x4b);
            eVar12 = get_error_flags();
            if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
              trap_instruction();
            }
            p_Var16 = (in_RDI->m_callbacks).m_error;
            Location::Location(in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                               (size_t)in_stack_fffffffffffff500,
                               CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                               (size_t)in_stack_fffffffffffff4f0);
            in_stack_fffffffffffff4f0 = in_stack_fffffffffffff7f8;
            in_stack_fffffffffffff4f8 = (undefined7)local_800;
            in_stack_fffffffffffff4ff = (char)((ulong)local_800 >> 0x38);
            LVar7.super_LineCol.line = (size_t)in_stack_fffffffffffff4f0;
            LVar7.super_LineCol.offset = (size_t)in_stack_fffffffffffff4e8;
            LVar7.super_LineCol.col._0_7_ = in_stack_fffffffffffff4f8;
            LVar7.super_LineCol.col._7_1_ = in_stack_fffffffffffff4ff;
            LVar7.name.str = (char *)pTStack_7f8;
            LVar7.name.len = (size_t)local_7f0;
            (*p_Var16)(local_7e8,0x4b,LVar7,(in_RDI->m_callbacks).m_user_data);
            in_stack_fffffffffffff500 = pTStack_7f8;
            in_stack_fffffffffffff508 = local_7f0;
          }
          p_Var18 = &local_550;
          local_4d8 = 1;
          local_4e0 = 1;
          local_4d0 = p_Var18;
          if (local_550.value.len == 0) {
            eVar12 = get_error_flags();
            if (((eVar12 & 1) != 0) &&
               (in_stack_fffffffffffff56f = is_debugger_attached(), (bool)in_stack_fffffffffffff56f)
               ) {
              trap_instruction();
            }
            local_4f0 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_4e8 = 0x1560;
            handle_error(0x389522,(char *)0x1560,"check failed: %s","left >= 0 && left <= len");
          }
          if ((p_Var18->value).len < local_4e0) {
            eVar12 = get_error_flags();
            if (((eVar12 & 1) != 0) &&
               (in_stack_fffffffffffff56e = is_debugger_attached(), (bool)in_stack_fffffffffffff56e)
               ) {
              trap_instruction();
            }
            local_500 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_4f8 = 0x1561;
            handle_error(0x389522,(char *)0x1561,"check failed: %s","right >= 0 && right <= len");
          }
          if (((p_Var18->value).len - local_4e0) + 1 < local_4d8) {
            eVar12 = get_error_flags();
            if (((eVar12 & 1) != 0) &&
               (in_stack_fffffffffffff56d = is_debugger_attached(), (bool)in_stack_fffffffffffff56d)
               ) {
              trap_instruction();
            }
            local_510 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            local_508 = 0x1562;
            handle_error(0x389522,(char *)0x1562,"check failed: %s","left <= len - right + 1");
          }
          basic_substring<const_char>::basic_substring
                    ((basic_substring<const_char> *)in_stack_fffffffffffff510,
                     in_stack_fffffffffffff508,(size_t)in_stack_fffffffffffff500);
          local_830 = local_4c8;
          local_828 = local_4c0;
          _local_820 = basic_substring<const_char>::trim
                                 ((basic_substring<const_char> *)in_stack_fffffffffffff500,
                                  in_stack_fffffffffffff4ff);
          local_550.value.str = local_820;
          local_848 = local_820;
          local_310 = local_820;
          local_318 = &local_838;
          local_328 = local_820;
          str_00.len = in_stack_fffffffffffff5f0;
          str_00.str = in_stack_fffffffffffff5e8;
          local_840 = (size_t)parent_00;
          local_550.value.len = (size_t)parent_00;
          local_320 = (size_t)parent_00;
          local_308 = (size_t)parent_00;
          bVar11 = atou<unsigned_long>(str_00,(unsigned_long *)
                                              CONCAT17(in_stack_fffffffffffff5e7,
                                                       in_stack_fffffffffffff5e0));
          if (!bVar11) {
            return 0xffffffffffffffff;
          }
          local_348 = *(undefined8 *)(local_530 + 8);
          local_10 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
          if (((local_10->m_type).type & (STREAM|MAP)) == NOTYPE) {
            local_418 = *(undefined8 *)(local_530 + 8);
            local_3f0 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
            if (((local_3f0->m_type).type & KEY) == NOTYPE) {
              _clear_type(in_stack_fffffffffffff4f0,(size_t)in_stack_fffffffffffff4e8);
              to_seq(in_stack_fffffffffffff610,in_stack_fffffffffffff608,in_stack_fffffffffffff600);
            }
            else {
              pcVar13 = Tree::key(in_stack_fffffffffffff548,(size_t)in_stack_fffffffffffff540);
              local_858 = pcVar13->str;
              local_850 = pcVar13->len;
              _clear_type(in_stack_fffffffffffff4f0,(size_t)in_stack_fffffffffffff4e8);
              local_868 = local_858;
              local_860 = local_850;
              key_00.len = in_stack_fffffffffffff660;
              key_00.str = in_stack_fffffffffffff658;
              to_seq(in_stack_fffffffffffff650,(size_t)in_RDI,key_00,
                     (type_bits)in_stack_fffffffffffff640);
            }
          }
          local_358 = *(undefined8 *)(local_530 + 8);
          local_8 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
          if (((local_8->m_type).type & (STREAM|MAP)) == NOTYPE) {
            memcpy(local_898,"check failed: (is_container(r->closest))",0x29);
            eVar12 = get_error_flags();
            if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
              trap_instruction();
            }
            in_stack_fffffffffffff560 = (in_RDI->m_callbacks).m_error;
            in_stack_fffffffffffff558 = local_898;
            Location::Location(in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                               (size_t)in_stack_fffffffffffff500,
                               CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                               (size_t)in_stack_fffffffffffff4f0);
            in_stack_fffffffffffff4f8 = (undefined7)local_8b0;
            in_stack_fffffffffffff4ff = (char)((ulong)local_8b0 >> 0x38);
            LVar8.super_LineCol.line = (size_t)pTStack_8b8;
            LVar8.super_LineCol.offset = (size_t)local_8c0;
            LVar8.super_LineCol.col._0_7_ = in_stack_fffffffffffff4f8;
            LVar8.super_LineCol.col._7_1_ = in_stack_fffffffffffff4ff;
            LVar8.name.str = (char *)pTStack_8a8;
            LVar8.name.len = (size_t)local_8a0;
            (*in_stack_fffffffffffff560)
                      (in_stack_fffffffffffff558,0x29,LVar8,(in_RDI->m_callbacks).m_user_data);
            in_stack_fffffffffffff4e8 = local_8c0;
            in_stack_fffffffffffff4f0 = pTStack_8b8;
            in_stack_fffffffffffff500 = pTStack_8a8;
            in_stack_fffffffffffff508 = local_8a0;
          }
          local_558 = Tree::child(in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                                  in_stack_fffffffffffff588);
          if (local_558 == 0xffffffffffffffff) {
            sVar15 = num_children(in_stack_fffffffffffff500,
                                  CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8));
            if (local_838 < sVar15) {
              memcpy(local_8f8,"check failed: (num_children(r->closest) <= idx)",0x30);
              eVar12 = get_error_flags();
              if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
                trap_instruction();
              }
              in_stack_fffffffffffff550 = (in_RDI->m_callbacks).m_error;
              pcVar17 = local_8f8;
              Location::Location(in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                                 (size_t)in_stack_fffffffffffff500,
                                 CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                                 (size_t)in_stack_fffffffffffff4f0);
              in_stack_fffffffffffff508 = in_stack_fffffffffffff700;
              in_stack_fffffffffffff4f8 = (undefined7)local_910;
              in_stack_fffffffffffff4ff = (char)((ulong)local_910 >> 0x38);
              LVar9.super_LineCol.line = (size_t)pTStack_918;
              LVar9.super_LineCol.offset = (size_t)local_920;
              LVar9.super_LineCol.col._0_7_ = in_stack_fffffffffffff4f8;
              LVar9.super_LineCol.col._7_1_ = in_stack_fffffffffffff4ff;
              LVar9.name.str = (char *)pTStack_908;
              LVar9.name.len = (size_t)in_stack_fffffffffffff508;
              in_stack_fffffffffffff700 = in_stack_fffffffffffff508;
              (*in_stack_fffffffffffff550)(pcVar17,0x30,LVar9,(in_RDI->m_callbacks).m_user_data);
              in_stack_fffffffffffff4e8 = local_920;
              in_stack_fffffffffffff4f0 = pTStack_918;
              in_stack_fffffffffffff500 = pTStack_908;
            }
            for (local_928 = num_children(in_stack_fffffffffffff500,
                                          CONCAT17(in_stack_fffffffffffff4ff,
                                                   in_stack_fffffffffffff4f8));
                local_928 <= local_838; local_928 = local_928 + 1) {
              sVar15 = *(size_t *)(local_530 + 8);
              pTVar19 = in_RDI;
              local_458 = sVar15;
              pNVar14 = _p(in_stack_fffffffffffff540,sVar15);
              local_60 = pNVar14->m_last_child;
              in_stack_fffffffffffff540 = in_RDI;
              local_58 = sVar15;
              if (sVar15 == 0xffffffffffffffff) {
                eVar12 = get_error_flags();
                if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
                  trap_instruction();
                }
                Location::Location((Location *)in_stack_fffffffffffff500,
                                   (char *)CONCAT17(in_stack_fffffffffffff4ff,
                                                    in_stack_fffffffffffff4f8),
                                   (size_t)in_stack_fffffffffffff4f0,
                                   (size_t)in_stack_fffffffffffff4e8);
                in_stack_fffffffffffff4f8 = (undefined7)local_78;
                in_stack_fffffffffffff4ff = (char)((ulong)local_78 >> 0x38);
                loc_08.super_LineCol.line = (size_t)in_stack_fffffffffffff558;
                loc_08.super_LineCol.offset = (size_t)in_stack_fffffffffffff550;
                loc_08.super_LineCol.col = (size_t)in_stack_fffffffffffff560;
                loc_08.name.str._0_5_ = in_stack_fffffffffffff568;
                loc_08.name.str._5_1_ = in_stack_fffffffffffff56d;
                loc_08.name.str._6_1_ = in_stack_fffffffffffff56e;
                loc_08.name.str._7_1_ = in_stack_fffffffffffff56f;
                loc_08.name.len = (size_t)p_Var18;
                in_stack_fffffffffffff4e8 = local_88;
                in_stack_fffffffffffff4f0 = pTStack_80;
                in_stack_fffffffffffff500 = pTStack_70;
                in_stack_fffffffffffff508 = local_68;
                error<29ul>((char (*) [29])in_RDI,loc_08);
                in_stack_fffffffffffff540 = in_RDI;
              }
              in_RDI = pTVar19;
              local_48 = local_58;
              local_38 = _p(in_stack_fffffffffffff540,sVar15);
              if ((((local_38->m_type).type & (STREAM|MAP)) == NOTYPE) &&
                 (bVar11 = is_root(in_stack_fffffffffffff540,sVar15), !bVar11)) {
                eVar12 = get_error_flags();
                if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
                  trap_instruction();
                }
                Location::Location((Location *)in_stack_fffffffffffff500,
                                   (char *)CONCAT17(in_stack_fffffffffffff4ff,
                                                    in_stack_fffffffffffff4f8),
                                   (size_t)in_stack_fffffffffffff4f0,
                                   (size_t)in_stack_fffffffffffff4e8);
                in_stack_fffffffffffff4f8 = (undefined7)local_a0;
                in_stack_fffffffffffff4ff = (char)((ulong)local_a0 >> 0x38);
                loc_09.super_LineCol.line = (size_t)in_stack_fffffffffffff558;
                loc_09.super_LineCol.offset = (size_t)in_stack_fffffffffffff550;
                loc_09.super_LineCol.col = (size_t)in_stack_fffffffffffff560;
                loc_09.name.str._0_5_ = in_stack_fffffffffffff568;
                loc_09.name.str._5_1_ = in_stack_fffffffffffff56d;
                loc_09.name.str._6_1_ = in_stack_fffffffffffff56e;
                loc_09.name.str._7_1_ = in_stack_fffffffffffff56f;
                loc_09.name.len = (size_t)p_Var18;
                in_stack_fffffffffffff4e8 = local_b0;
                in_stack_fffffffffffff4f0 = pTStack_a8;
                in_stack_fffffffffffff500 = pTStack_98;
                in_stack_fffffffffffff508 = local_90;
                error<54ul>((char (*) [54])in_stack_fffffffffffff540,loc_09);
              }
              if ((local_60 != 0xffffffffffffffff) &&
                 (pNVar14 = _p(in_stack_fffffffffffff540,sVar15), pNVar14->m_parent != local_58)) {
                eVar12 = get_error_flags();
                if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
                  trap_instruction();
                }
                Location::Location((Location *)in_stack_fffffffffffff500,
                                   (char *)CONCAT17(in_stack_fffffffffffff4ff,
                                                    in_stack_fffffffffffff4f8),
                                   (size_t)in_stack_fffffffffffff4f0,
                                   (size_t)in_stack_fffffffffffff4e8);
                in_stack_fffffffffffff4f8 = (undefined7)local_c8;
                in_stack_fffffffffffff4ff = (char)((ulong)local_c8 >> 0x38);
                loc_10.super_LineCol.line = (size_t)in_stack_fffffffffffff558;
                loc_10.super_LineCol.offset = (size_t)in_stack_fffffffffffff550;
                loc_10.super_LineCol.col = (size_t)in_stack_fffffffffffff560;
                loc_10.name.str._0_5_ = in_stack_fffffffffffff568;
                loc_10.name.str._5_1_ = in_stack_fffffffffffff56d;
                loc_10.name.str._6_1_ = in_stack_fffffffffffff56e;
                loc_10.name.str._7_1_ = in_stack_fffffffffffff56f;
                loc_10.name.len = (size_t)p_Var18;
                in_stack_fffffffffffff4e8 = local_d8;
                in_stack_fffffffffffff4f0 = pTStack_d0;
                in_stack_fffffffffffff500 = pTStack_c0;
                in_stack_fffffffffffff508 = local_b8;
                error<63ul>((char (*) [63])in_stack_fffffffffffff540,loc_10);
              }
              local_e0 = _claim(in_stack_fffffffffffff6c0);
              _set_hierarchy((Tree *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                             in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,
                             in_stack_fffffffffffff9a8);
              local_558 = local_e0;
              if (local_928 < local_838) {
                local_3e8 = *(undefined8 *)(local_530 + 8);
                local_3d8 = _p(in_stack_fffffffffffff540,sVar15);
                if (((local_3d8->m_type).type & MAP) == NOTYPE) {
                  local_388 = *(undefined8 *)(local_530 + 8);
                  local_378 = _p(in_stack_fffffffffffff540,sVar15);
                  if (((local_378->m_type).type & SEQ) != NOTYPE) {
                    basic_substring<const_char>::basic_substring(&local_958);
                    val.len = in_stack_fffffffffffff660;
                    val.str = in_stack_fffffffffffff658;
                    to_val(in_stack_fffffffffffff650,(size_t)in_RDI,val,
                           (type_bits)in_stack_fffffffffffff640);
                  }
                }
                else {
                  basic_substring<const_char>::basic_substring
                            ((basic_substring<const_char> *)&stack0xfffffffffffff6c8);
                  basic_substring<const_char>::basic_substring
                            ((basic_substring<const_char> *)&stack0xfffffffffffff6b8);
                  in_stack_fffffffffffff4e8 = (lookup_result *)0x0;
                  key_01.len._0_4_ = in_stack_fffffffffffff6a0;
                  key_01.str = (char *)in_stack_fffffffffffff698;
                  key_01.len._4_4_ = in_stack_fffffffffffff6a4;
                  val_00.len._0_4_ = in_stack_fffffffffffff690;
                  val_00.str = (char *)in_stack_fffffffffffff688;
                  val_00.len._4_4_ = in_stack_fffffffffffff694;
                  to_keyval(in_stack_fffffffffffff680,in_stack_fffffffffffff678,key_01,val_00,
                            (type_bits)in_stack_fffffffffffff700);
                }
              }
            }
          }
        }
        else {
          eVar12 = get_error_flags();
          if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
            trap_instruction();
          }
          handle_error(0x389522,(char *)0x699e,"never reach this point");
        }
      }
      goto LAB_00322533;
    }
  }
  bVar11 = basic_substring<const_char>::begins_with(&local_550.value,'[');
  if (bVar11) {
    memcpy(local_588,"check failed: (!token.value.begins_with(\'[\'))",0x2e);
    eVar12 = get_error_flags();
    if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
      trap_instruction();
    }
    in_stack_fffffffffffff640 = (in_RDI->m_callbacks).m_error;
    Location::Location(in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                       (size_t)in_stack_fffffffffffff500,
                       CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                       (size_t)in_stack_fffffffffffff4f0);
    in_stack_fffffffffffff4f8 = (undefined7)local_5a0;
    in_stack_fffffffffffff4ff = (char)((ulong)local_5a0 >> 0x38);
    LVar1.super_LineCol.line = (size_t)pTStack_5a8;
    LVar1.super_LineCol.offset = (size_t)local_5b0;
    LVar1.super_LineCol.col._0_7_ = in_stack_fffffffffffff4f8;
    LVar1.super_LineCol.col._7_1_ = in_stack_fffffffffffff4ff;
    LVar1.name.str = (char *)pTStack_598;
    LVar1.name.len = (size_t)local_590;
    (*in_stack_fffffffffffff640)(local_588,0x2e,LVar1,(in_RDI->m_callbacks).m_user_data);
    in_stack_fffffffffffff4e8 = local_5b0;
    in_stack_fffffffffffff4f0 = pTStack_5a8;
    in_stack_fffffffffffff500 = pTStack_598;
    in_stack_fffffffffffff508 = local_590;
  }
  local_338 = *(undefined8 *)(local_530 + 8);
  local_18 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
  if (((local_18->m_type).type & (STREAM|MAP)) == NOTYPE) {
    local_408 = *(undefined8 *)(local_530 + 8);
    local_3f8 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
    if (((local_3f8->m_type).type & KEY) == NOTYPE) {
      to_map(in_stack_fffffffffffff610,in_stack_fffffffffffff608,in_stack_fffffffffffff600);
    }
    else {
      pcVar13 = Tree::key(in_stack_fffffffffffff548,(size_t)in_stack_fffffffffffff540);
      local_5c0 = pcVar13->str;
      local_5b8 = pcVar13->len;
      key.len = in_stack_fffffffffffff660;
      key.str = in_stack_fffffffffffff658;
      to_map(in_stack_fffffffffffff650,(size_t)in_RDI,key,(type_bits)in_stack_fffffffffffff640);
    }
  }
  else {
    local_3a0 = *(undefined8 *)(local_530 + 8);
    local_390 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
    if (((local_390->m_type).type & MAP) == NOTYPE) {
      local_5c8 = -1;
      local_5d8 = local_550.value.str;
      local_5d0 = local_550.value.len;
      local_2e8 = local_550.value.str;
      local_2e0 = local_550.value.len;
      local_2f0 = &local_5c8;
      local_300 = local_550.value.str;
      local_2f8 = local_550.value.len;
      str.len = in_stack_fffffffffffff5f0;
      str.str = in_stack_fffffffffffff5e8;
      bVar11 = atou<unsigned_long>(str,(unsigned_long *)
                                       CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0)
                                  );
      if (!bVar11) {
        memcpy(local_608,"check failed: c4::atox(token.value, &pos)",0x2a);
        eVar12 = get_error_flags();
        in_stack_fffffffffffff4e8 = in_stack_fffffffffffff9d0;
        if (((eVar12 & 1) != 0) &&
           (bVar11 = is_debugger_attached(), in_stack_fffffffffffff4e8 = in_stack_fffffffffffff9d0,
           bVar11)) {
          trap_instruction();
          in_stack_fffffffffffff4e8 = in_stack_fffffffffffff9d0;
        }
        p_Var16 = (in_RDI->m_callbacks).m_error;
        Location::Location(in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                           (size_t)in_stack_fffffffffffff500,
                           CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                           (size_t)in_stack_fffffffffffff4f0);
        in_stack_fffffffffffff4f0 = in_stack_fffffffffffff9d8;
        in_stack_fffffffffffff4f8 = (undefined7)in_stack_fffffffffffff9e0;
        in_stack_fffffffffffff4ff = (char)((ulong)in_stack_fffffffffffff9e0 >> 0x38);
        LVar2.super_LineCol.line = (size_t)in_stack_fffffffffffff4f0;
        LVar2.super_LineCol.offset = (size_t)in_stack_fffffffffffff4e8;
        LVar2.super_LineCol.col._0_7_ = in_stack_fffffffffffff4f8;
        LVar2.super_LineCol.col._7_1_ = in_stack_fffffffffffff4ff;
        LVar2.name.str = (char *)pTStack_618;
        LVar2.name.len = (size_t)local_610;
        (*p_Var16)(local_608,0x2a,LVar2,(in_RDI->m_callbacks).m_user_data);
        in_stack_fffffffffffff500 = pTStack_618;
        in_stack_fffffffffffff508 = local_610;
      }
      if (local_5c8 == -1) {
        in_stack_fffffffffffff9a8._0_1_ = 'c';
        in_stack_fffffffffffff9a8._1_1_ = 'h';
        in_stack_fffffffffffff9a8._2_1_ = 'e';
        in_stack_fffffffffffff9a8._3_1_ = 'c';
        in_stack_fffffffffffff9a8._4_1_ = 'k';
        in_stack_fffffffffffff9a8._5_1_ = ' ';
        in_stack_fffffffffffff9a8._6_1_ = 'f';
        in_stack_fffffffffffff9a8._7_1_ = 'a';
        in_stack_fffffffffffff9b0._0_1_ = 'i';
        in_stack_fffffffffffff9b0._1_1_ = 'l';
        in_stack_fffffffffffff9b0._2_1_ = 'e';
        in_stack_fffffffffffff9b0._3_1_ = 'd';
        in_stack_fffffffffffff9b0._4_1_ = ':';
        in_stack_fffffffffffff9b0._5_1_ = ' ';
        in_stack_fffffffffffff9b0._6_1_ = '(';
        in_stack_fffffffffffff9b0._7_1_ = 'p';
        in_stack_fffffffffffff9b8._0_1_ = 'o';
        in_stack_fffffffffffff9b8._1_1_ = 's';
        in_stack_fffffffffffff9b8._2_1_ = ' ';
        in_stack_fffffffffffff9b8._3_1_ = '!';
        in_stack_fffffffffffff9b8._4_1_ = '=';
        in_stack_fffffffffffff9b8._5_1_ = ' ';
        in_stack_fffffffffffff9b8._6_1_ = 'N';
        in_stack_fffffffffffff9b8._7_1_ = 'O';
        in_stack_fffffffffffff9c0 = 0x29454e;
        eVar12 = get_error_flags();
        if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
          trap_instruction();
        }
        p_Var16 = (in_RDI->m_callbacks).m_error;
        pcVar17 = &stack0xfffffffffffff9a8;
        Location::Location(in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                           (size_t)in_stack_fffffffffffff500,
                           CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                           (size_t)in_stack_fffffffffffff4f0);
        in_stack_fffffffffffff4f8 = (undefined7)local_670;
        in_stack_fffffffffffff4ff = (char)((ulong)local_670 >> 0x38);
        LVar3.super_LineCol.line = (size_t)pTStack_678;
        LVar3.super_LineCol.offset = (size_t)local_680;
        LVar3.super_LineCol.col._0_7_ = in_stack_fffffffffffff4f8;
        LVar3.super_LineCol.col._7_1_ = in_stack_fffffffffffff4ff;
        LVar3.name.str = (char *)pTStack_668;
        LVar3.name.len = (size_t)local_660;
        (*p_Var16)(pcVar17,0x1c,LVar3,(in_RDI->m_callbacks).m_user_data);
        in_stack_fffffffffffff4e8 = local_680;
        in_stack_fffffffffffff4f0 = pTStack_678;
        in_stack_fffffffffffff500 = pTStack_668;
        in_stack_fffffffffffff508 = local_660;
      }
      local_558 = Tree::child(in_stack_fffffffffffff598,in_stack_fffffffffffff590,
                              in_stack_fffffffffffff588);
    }
    else {
      local_558 = find_child(in_stack_fffffffffffff6d0,(size_t)in_stack_fffffffffffff6c8,
                             (csubstr *)in_stack_fffffffffffff6c0);
    }
  }
  if (local_558 == 0xffffffffffffffff) {
    local_3b8 = *(undefined8 *)(local_530 + 8);
    local_3a8 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
    if (((local_3a8->m_type).type & MAP) == NOTYPE) {
      memcpy(local_6a8,"check failed: (is_map(r->closest))",0x23);
      eVar12 = get_error_flags();
      if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
        trap_instruction();
      }
      p_Var16 = (in_RDI->m_callbacks).m_error;
      pcVar17 = local_6a8;
      Location::Location(in_stack_fffffffffffff510,in_stack_fffffffffffff508,
                         (size_t)in_stack_fffffffffffff500,
                         CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                         (size_t)in_stack_fffffffffffff4f0);
      in_stack_fffffffffffff4f8 = (undefined7)local_6c0;
      in_stack_fffffffffffff4ff = (char)((ulong)local_6c0 >> 0x38);
      LVar4.super_LineCol.line = (size_t)pTStack_6c8;
      LVar4.super_LineCol.offset = (size_t)local_6d0;
      LVar4.super_LineCol.col._0_7_ = in_stack_fffffffffffff4f8;
      LVar4.super_LineCol.col._7_1_ = in_stack_fffffffffffff4ff;
      LVar4.name.str = (char *)pTStack_6b8;
      LVar4.name.len = (size_t)local_6b0;
      (*p_Var16)(pcVar17,0x23,LVar4,(in_RDI->m_callbacks).m_user_data);
      in_stack_fffffffffffff4e8 = local_6d0;
      in_stack_fffffffffffff4f0 = pTStack_6c8;
      in_stack_fffffffffffff500 = pTStack_6b8;
      in_stack_fffffffffffff508 = local_6b0;
    }
    sVar15 = *(size_t *)(local_530 + 8);
    local_428 = sVar15;
    pNVar14 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
    local_258 = pNVar14->m_last_child;
    local_250 = sVar15;
    if (sVar15 == 0xffffffffffffffff) {
      eVar12 = get_error_flags();
      if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
        trap_instruction();
      }
      Location::Location((Location *)in_stack_fffffffffffff500,
                         (char *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                         (size_t)in_stack_fffffffffffff4f0,(size_t)in_stack_fffffffffffff4e8);
      in_stack_fffffffffffff4f8 = (undefined7)local_270;
      in_stack_fffffffffffff4ff = (char)((ulong)local_270 >> 0x38);
      loc.super_LineCol.line = (size_t)in_stack_fffffffffffff558;
      loc.super_LineCol.offset = (size_t)in_stack_fffffffffffff550;
      loc.super_LineCol.col = (size_t)in_stack_fffffffffffff560;
      loc.name.str._0_5_ = in_stack_fffffffffffff568;
      loc.name.str._5_1_ = in_stack_fffffffffffff56d;
      loc.name.str._6_1_ = in_stack_fffffffffffff56e;
      loc.name.str._7_1_ = in_stack_fffffffffffff56f;
      loc.name.len = in_stack_fffffffffffff570;
      error<29ul>((char (*) [29])in_stack_fffffffffffff540,loc);
      in_stack_fffffffffffff4e8 = local_280;
      in_stack_fffffffffffff4f0 = pTStack_278;
      in_stack_fffffffffffff500 = pTStack_268;
      in_stack_fffffffffffff508 = local_260;
    }
    local_240 = local_250;
    local_20 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
    if ((((local_20->m_type).type & (STREAM|MAP)) == NOTYPE) &&
       (bVar11 = is_root(in_stack_fffffffffffff540,in_stack_fffffffffffff538), !bVar11)) {
      eVar12 = get_error_flags();
      if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
        trap_instruction();
      }
      Location::Location((Location *)in_stack_fffffffffffff500,
                         (char *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                         (size_t)in_stack_fffffffffffff4f0,(size_t)in_stack_fffffffffffff4e8);
      in_stack_fffffffffffff4f8 = (undefined7)local_298;
      in_stack_fffffffffffff4ff = (char)((ulong)local_298 >> 0x38);
      loc_00.super_LineCol.line = (size_t)in_stack_fffffffffffff558;
      loc_00.super_LineCol.offset = (size_t)in_stack_fffffffffffff550;
      loc_00.super_LineCol.col = (size_t)in_stack_fffffffffffff560;
      loc_00.name.str._0_5_ = in_stack_fffffffffffff568;
      loc_00.name.str._5_1_ = in_stack_fffffffffffff56d;
      loc_00.name.str._6_1_ = in_stack_fffffffffffff56e;
      loc_00.name.str._7_1_ = in_stack_fffffffffffff56f;
      loc_00.name.len = in_stack_fffffffffffff570;
      error<54ul>((char (*) [54])in_stack_fffffffffffff540,loc_00);
      in_stack_fffffffffffff4e8 = local_2a8;
      in_stack_fffffffffffff4f0 = pTStack_2a0;
      in_stack_fffffffffffff500 = pTStack_290;
      in_stack_fffffffffffff508 = local_288;
    }
    if ((local_258 != 0xffffffffffffffff) &&
       (pNVar14 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538),
       pNVar14->m_parent != local_250)) {
      eVar12 = get_error_flags();
      if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
        trap_instruction();
      }
      Location::Location((Location *)in_stack_fffffffffffff500,
                         (char *)CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                         (size_t)in_stack_fffffffffffff4f0,(size_t)in_stack_fffffffffffff4e8);
      in_stack_fffffffffffff4f8 = (undefined7)local_2c0;
      in_stack_fffffffffffff4ff = (char)((ulong)local_2c0 >> 0x38);
      loc_01.super_LineCol.line = (size_t)in_stack_fffffffffffff558;
      loc_01.super_LineCol.offset = (size_t)in_stack_fffffffffffff550;
      loc_01.super_LineCol.col = (size_t)in_stack_fffffffffffff560;
      loc_01.name.str._0_5_ = in_stack_fffffffffffff568;
      loc_01.name.str._5_1_ = in_stack_fffffffffffff56d;
      loc_01.name.str._6_1_ = in_stack_fffffffffffff56e;
      loc_01.name.str._7_1_ = in_stack_fffffffffffff56f;
      loc_01.name.len = in_stack_fffffffffffff570;
      error<63ul>((char (*) [63])in_stack_fffffffffffff540,loc_01);
      in_stack_fffffffffffff4f0 = pTStack_2c8;
      in_stack_fffffffffffff500 = pTStack_2b8;
      in_stack_fffffffffffff508 = local_2b0;
    }
    local_2d8 = _claim(in_stack_fffffffffffff6c0);
    _set_hierarchy((Tree *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                   in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8);
    local_558 = local_2d8;
    local_6d8 = _p(in_stack_fffffffffffff540,in_stack_fffffffffffff538);
    (local_6d8->m_key).scalar.str = local_550.value.str;
    (local_6d8->m_key).scalar.len = local_550.value.len;
    local_468 = 2;
    (local_6d8->m_type).type = (local_6d8->m_type).type | KEY;
    local_460 = local_6d8;
  }
LAB_00322533:
  if (local_558 == 0xffffffffffffffff) {
    eVar12 = get_error_flags();
    if (((eVar12 & 1) != 0) && (bVar11 = is_debugger_attached(), bVar11)) {
      trap_instruction();
    }
    p_Var16 = (in_RDI->m_callbacks).m_error;
    this_00 = (Location *)&stack0xfffffffffffff678;
    Location::Location(this_00,in_stack_fffffffffffff508,(size_t)in_stack_fffffffffffff500,
                       CONCAT17(in_stack_fffffffffffff4ff,in_stack_fffffffffffff4f8),
                       (size_t)in_stack_fffffffffffff4f0);
    LVar10.super_LineCol.line = (size_t)in_stack_fffffffffffff658;
    LVar10.super_LineCol.offset = (size_t)in_stack_fffffffffffff650;
    LVar10.super_LineCol.col._0_7_ = (int7)in_stack_fffffffffffff660;
    LVar10.super_LineCol.col._7_1_ = (char)(in_stack_fffffffffffff660 >> 0x38);
    LVar10.name.str = (char *)uStack_998;
    LVar10.name.len = local_990;
    (*p_Var16)((char *)this_00,0x1d,LVar10,(in_RDI->m_callbacks).m_user_data);
  }
  *local_538 = local_550.value.str;
  local_538[1] = local_550.value.len;
  local_538[2] = local_550.type.type;
  return local_558;
}

Assistant:

size_t Tree::_next_node_modify(lookup_result * r, _lookup_path_token *parent)
{
    _lookup_path_token token = _next_token(r, *parent);
    if( ! token)
        return NONE;

    size_t node = NONE;
    if(token.type == MAP || token.type == SEQ)
    {
        _RYML_CB_ASSERT(m_callbacks, !token.value.begins_with('['));
        //_RYML_CB_ASSERT(m_callbacks, is_container(r->closest) || r->closest == NONE);
        if( ! is_container(r->closest))
        {
            if(has_key(r->closest))
                to_map(r->closest, key(r->closest));
            else
                to_map(r->closest);
        }
        else
        {
            if(is_map(r->closest))
                node = find_child(r->closest, token.value);
            else
            {
                size_t pos = NONE;
                _RYML_CB_CHECK(m_callbacks, c4::atox(token.value, &pos));
                _RYML_CB_ASSERT(m_callbacks, pos != NONE);
                node = child(r->closest, pos);
            }
        }
        if(node == NONE)
        {
            _RYML_CB_ASSERT(m_callbacks, is_map(r->closest));
            node = append_child(r->closest);
            NodeData *n = _p(node);
            n->m_key.scalar = token.value;
            n->m_type.add(KEY);
        }
    }
    else if(token.type == KEYVAL)
    {
        _RYML_CB_ASSERT(m_callbacks, r->unresolved().empty());
        if(is_map(r->closest))
        {
            node = find_child(r->closest, token.value);
            if(node == NONE)
                node = append_child(r->closest);
        }
        else
        {
            _RYML_CB_ASSERT(m_callbacks, !is_seq(r->closest));
            _add_flags(r->closest, MAP);
            node = append_child(r->closest);
        }
        NodeData *n = _p(node);
        n->m_key.scalar = token.value;
        n->m_val.scalar = "";
        n->m_type.add(KEYVAL);
    }
    else if(token.type == KEY)
    {
        _RYML_CB_ASSERT(m_callbacks, token.value.begins_with('[') && token.value.ends_with(']'));
        token.value = token.value.offs(1, 1).trim(' ');
        size_t idx;
        if( ! from_chars(token.value, &idx))
             return NONE;
        if( ! is_container(r->closest))
        {
            if(has_key(r->closest))
            {
                csubstr k = key(r->closest);
                _clear_type(r->closest);
                to_seq(r->closest, k);
            }
            else
            {
                _clear_type(r->closest);
                to_seq(r->closest);
            }
        }
        _RYML_CB_ASSERT(m_callbacks, is_container(r->closest));
        node = child(r->closest, idx);
        if(node == NONE)
        {
            _RYML_CB_ASSERT(m_callbacks, num_children(r->closest) <= idx);
            for(size_t i = num_children(r->closest); i <= idx; ++i)
            {
                node = append_child(r->closest);
                if(i < idx)
                {
                    if(is_map(r->closest))
                        to_keyval(node, /*"~"*/{}, /*"~"*/{});
                    else if(is_seq(r->closest))
                        to_val(node, /*"~"*/{});
                }
            }
        }
    }
    else
    {
        C4_NEVER_REACH();
    }

    _RYML_CB_ASSERT(m_callbacks, node != NONE);
    *parent = token;
    return node;
}